

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O1

int32_t __thiscall wasm::Random::get32(Random *this)

{
  byte bVar1;
  int8_t iVar2;
  byte bVar3;
  int8_t iVar4;
  
  bVar1 = get(this);
  iVar2 = get(this);
  bVar3 = get(this);
  iVar4 = get(this);
  return (int)(short)((short)iVar4 | (ushort)bVar3 << 8) | ((int)iVar2 | (uint)bVar1 << 8) << 0x10;
}

Assistant:

int32_t Random::get32() {
  auto temp = uint32_t(get16()) << 16;
  return temp | uint32_t(get16());
}